

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

void __thiscall
embree::Instantiator::Instantiator
          (Instantiator *this,Ref<embree::HeightField> *heightField,
          Ref<embree::SceneGraph::Node> *object,Ref<embree::Image> *distribution,float minDistance,
          size_t N)

{
  HeightField *pHVar1;
  Node *pNVar2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t height;
  size_t width;
  vector<float,_std::allocator<float>_> values;
  undefined1 local_89;
  undefined8 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  Instantiator *local_78;
  size_t local_70;
  long local_68;
  size_t local_60;
  ulong local_58;
  vector<float,_std::allocator<float>_> local_50;
  pointer local_38;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Instantiator_001d5ec8;
  pHVar1 = heightField->ptr;
  (this->heightField).ptr = pHVar1;
  if (pHVar1 != (HeightField *)0x0) {
    (*(pHVar1->super_RefCount)._vptr_RefCount[2])();
  }
  pNVar2 = object->ptr;
  (this->object).ptr = pNVar2;
  if (pNVar2 != (Node *)0x0) {
    (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
  }
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->N = N;
  uVar3 = distribution->ptr->width;
  sVar10 = distribution->ptr->height;
  local_78 = this;
  local_60 = sVar10;
  local_58 = uVar3;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_50,sVar10 * uVar3,(allocator_type *)&local_88);
  if (sVar10 != 0) {
    local_68 = uVar3 * 4;
    lVar7 = 0;
    uVar8 = 0;
    uVar6 = uVar3;
    local_70 = sVar10;
    do {
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar9 = 0;
        do {
          (*(distribution->ptr->super_RefCount)._vptr_RefCount[4])
                    (&local_88,distribution->ptr,uVar9,uVar8);
          *(float *)((long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar9 * 4 + lVar7) =
               (float)local_88 * 0.212671 +
               local_88._4_4_ * 0.71516 + _Stack_80._M_pi._0_4_ * 0.072169;
          uVar9 = uVar9 + 1;
          uVar6 = uVar3;
          sVar10 = local_70;
        } while (uVar9 < uVar3);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + local_68;
    } while (uVar8 < sVar10);
  }
  local_38 = local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_88 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<embree::Distribution2D,std::allocator<embree::Distribution2D>,float*,unsigned_long&,unsigned_long&>
            (&_Stack_80,(Distribution2D **)&local_88,(allocator<embree::Distribution2D> *)&local_89,
             &local_38,&local_58,&local_60);
  _Var5._M_pi = _Stack_80._M_pi;
  peVar4 = local_88;
  local_88 = (Distribution2D *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (local_78->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (local_78->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  (local_78->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     _Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Instantiator(const Ref<HeightField>& heightField,
                 const Ref<SceneGraph::Node>& object, const Ref<Image>& distribution, float minDistance, size_t N)
      : heightField(heightField), object(object), /*minDistance(minDistance),*/ N(N)
    {
      /* create distribution */
      size_t width = distribution->width;
      size_t height = distribution->height;
      std::vector<float> values(width*height);
      for (size_t y=0; y<height; y++)
        for (size_t x=0; x<width; x++)
          values[y*width+x] = luminance(distribution->get(x,y));
      dist = std::make_shared<Distribution2D>(values.data(),width,height);
    }